

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_fma::forward_inplace(Sigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [24];
  undefined1 auVar39 [16];
  long *in_RSI;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [32];
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  int local_1238;
  undefined8 local_1228;
  undefined8 local_1220;
  undefined8 local_1218;
  undefined4 local_1210;
  long local_1208;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined4 local_11f0;
  undefined8 local_11e8;
  undefined1 (*local_11e0) [32];
  int local_11d4;
  int local_11d0;
  int local_11cc;
  int local_11c8;
  int local_11c4;
  int local_11c0;
  int local_11bc;
  long *local_11b0;
  undefined1 local_119d;
  int local_119c;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1178;
  undefined4 local_1164;
  undefined1 local_1160 [32];
  undefined1 (*local_1128) [32];
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [8];
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [8];
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  ulong uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 (*local_e88) [32];
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined4 local_e64;
  undefined1 local_e60 [16];
  undefined1 (*local_e48) [32];
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined1 local_df0 [8];
  undefined8 uStack_de8;
  undefined1 local_de0 [16];
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [16];
  undefined1 local_db0 [8];
  undefined8 uStack_da8;
  undefined1 local_da0 [8];
  undefined8 uStack_d98;
  undefined1 local_d90 [16];
  undefined1 local_d80 [16];
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  ulong uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined1 (*local_cd8) [32];
  long local_cd0;
  undefined4 local_cc4;
  long local_cc0;
  undefined1 (*local_cb8) [32];
  undefined4 local_cac;
  int local_ca8;
  int local_ca4;
  undefined8 *local_ca0;
  undefined4 local_c94;
  long local_c90;
  undefined8 *local_c70;
  undefined1 local_c40 [16];
  undefined1 auStack_c30 [16];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  float *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  float *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  float *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  float *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  float *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  float *local_ad8;
  float *local_ad0;
  undefined1 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 *local_a70;
  float *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  float *local_a50;
  undefined1 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined4 local_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0 [2];
  float afStack_7b8 [2];
  float afStack_7b0 [2];
  float afStack_7a8 [2];
  float local_7a0 [2];
  float afStack_798 [2];
  float afStack_790 [2];
  float afStack_788 [2];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760 [2];
  float afStack_758 [2];
  float afStack_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700 [2];
  float afStack_6f8 [2];
  float afStack_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0 [2];
  float afStack_698 [2];
  float afStack_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640 [2];
  float afStack_638 [2];
  float afStack_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0 [2];
  float afStack_5d8 [2];
  float afStack_5d0 [2];
  float afStack_5c8 [2];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500 [2];
  float afStack_4f8 [2];
  float afStack_4f0 [2];
  float afStack_4e8 [2];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  float afStack_490 [2];
  float afStack_488 [2];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined4 local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 local_340 [16];
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  float *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  float *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  float *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  float *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  float *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  float *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_11bc = *(int *)((long)in_RSI + 0x2c);
  local_11c0 = (int)in_RSI[6];
  local_11c4 = *(int *)((long)in_RSI + 0x34);
  local_11c8 = (int)in_RSI[7];
  local_11cc = (int)in_RSI[3];
  local_11d0 = local_11bc * local_11c0 * local_11c4 * local_11cc;
  local_11b0 = in_RSI;
  for (local_11d4 = 0; local_11d4 < local_11c8; local_11d4 = local_11d4 + 1) {
    local_1190 = &local_1228;
    local_ca4 = *(int *)((long)local_11b0 + 0x2c);
    local_ca8 = (int)local_11b0[6];
    local_cac = *(undefined4 *)((long)local_11b0 + 0x34);
    local_cb8 = (undefined1 (*) [32])
                (*local_11b0 + local_11b0[8] * (long)local_11d4 * local_11b0[2]);
    local_cc0 = local_11b0[2];
    local_cc4 = (undefined4)local_11b0[3];
    local_cd0 = local_11b0[4];
    local_ca0 = &local_1228;
    local_c90 = (long)local_ca4 * (long)local_ca8 * local_cc0;
    local_1188 = &local_1228;
    local_1178 = &local_1228;
    local_c94 = 0x10;
    local_119c = local_11d4;
    local_119d = 1;
    local_1228 = 0;
    local_1218 = 0;
    local_1210 = 0;
    local_1200 = 0;
    local_11fc = 0;
    local_11f8 = 0;
    local_11f4 = 0;
    local_11f0 = 0;
    local_11e8 = 0;
    local_1220 = 0;
    local_1238 = 0;
    local_1164 = 0x3f800000;
    local_c04 = 0x3f800000;
    local_c08 = 0x3f800000;
    local_c0c = 0x3f800000;
    local_c10 = 0x3f800000;
    local_c14 = 0x3f800000;
    local_c18 = 0x3f800000;
    local_c1c = 0x3f800000;
    local_c20 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_c40 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_c30 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1160._8_8_ = SUB328(ZEXT832(0),4);
    local_11e0 = local_cb8;
    for (; local_1238 + 7 < local_11d0; local_1238 = local_1238 + 8) {
      local_1128 = local_11e0;
      auVar38 = *(undefined1 (*) [24])*local_11e0;
      uStack_ee8 = *(undefined8 *)(*local_11e0 + 0x18);
      local_1100 = local_c40._0_8_;
      uStack_10f8 = local_c40._8_8_;
      uStack_10f0 = auStack_c30._0_8_;
      uStack_10e8 = auStack_c30._8_8_;
      local_ee0 = 0;
      uStack_ed8 = local_1160._8_8_;
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_12a0 = auVar38._0_8_;
      local_f00 = local_12a0;
      uStack_1298 = auVar38._8_8_;
      uStack_ef8 = uStack_1298;
      uStack_1290 = auVar38._16_8_;
      uStack_ef0 = uStack_1290;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_1160._8_8_) << 0x40,*local_11e0);
      local_fa0 = ZEXT832(0) << 0x20;
      local_1040 = 0x3f8000003f800000;
      uStack_1038 = 0x3f8000003f800000;
      uStack_1030 = 0x3f8000003f800000;
      uStack_1028 = 0x3f8000003f800000;
      local_fc0._0_8_ = auVar6._0_8_;
      local_be0 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar6._8_8_;
      uStack_bd8 = local_fc0._8_8_;
      local_fc0._16_8_ = auVar6._16_8_;
      uStack_bd0 = local_fc0._16_8_;
      local_fc0._24_8_ = auVar6._24_8_;
      uStack_bc8 = local_fc0._24_8_;
      local_c00 = 0x42b0c0a542b0c0a5;
      uStack_bf8 = 0x42b0c0a542b0c0a5;
      uStack_bf0 = 0x42b0c0a542b0c0a5;
      uStack_be8 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5._16_8_ = 0x42b0c0a542b0c0a5;
      auVar5._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar5);
      local_fc0._0_8_ = auVar6._0_8_;
      local_ba0 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar6._8_8_;
      uStack_b98 = local_fc0._8_8_;
      local_fc0._16_8_ = auVar6._16_8_;
      uStack_b90 = local_fc0._16_8_;
      local_fc0._24_8_ = auVar6._24_8_;
      uStack_b88 = local_fc0._24_8_;
      local_bc0 = 0xc2b0c0a5c2b0c0a5;
      uStack_bb8 = 0xc2b0c0a5c2b0c0a5;
      uStack_bb0 = 0xc2b0c0a5c2b0c0a5;
      uStack_ba8 = 0xc2b0c0a5c2b0c0a5;
      auVar13._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar13);
      local_b68 = local_fc0;
      local_ad0 = ::_ps256_cephes_LOG2EF;
      local_ad8 = ::_ps256_0p5;
      local_fc0._0_8_ = auVar4._0_8_;
      local_780 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar4._8_8_;
      uStack_778 = local_fc0._8_8_;
      local_fc0._16_8_ = auVar4._16_8_;
      uStack_770 = local_fc0._16_8_;
      local_fc0._24_8_ = auVar4._24_8_;
      uStack_768 = local_fc0._24_8_;
      local_7a0[0] = 1.442695;
      local_7a0[1] = 1.442695;
      afStack_798[0] = 1.442695;
      afStack_798[1] = 1.442695;
      afStack_790[0] = 1.442695;
      afStack_790[1] = 1.442695;
      afStack_788[0] = 1.442695;
      afStack_788[1] = 1.442695;
      local_7c0[0] = 0.5;
      local_7c0[1] = 0.5;
      afStack_7b8[0] = 0.5;
      afStack_7b8[1] = 0.5;
      afStack_7b0[0] = 0.5;
      afStack_7b0[1] = 0.5;
      afStack_7a8[0] = 0.5;
      afStack_7a8[1] = 0.5;
      auVar15._8_4_ = 1.442695;
      auVar15._12_4_ = 1.442695;
      auVar15._0_4_ = 1.442695;
      auVar15._4_4_ = 1.442695;
      auVar15._16_4_ = 1.442695;
      auVar15._20_4_ = 1.442695;
      auVar15._24_4_ = 1.442695;
      auVar15._28_4_ = 1.442695;
      auVar14._8_4_ = 0.5;
      auVar14._12_4_ = 0.5;
      auVar14._0_4_ = 0.5;
      auVar14._4_4_ = 0.5;
      auVar14._16_4_ = 0.5;
      auVar14._20_4_ = 0.5;
      auVar14._24_4_ = 0.5;
      auVar14._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar15,auVar4,auVar14);
      auVar5 = vroundps_avx(ZEXT1632(auVar2),1);
      auVar6 = vcmpps_avx(ZEXT1632(auVar2),auVar5,1);
      local_1060._0_8_ = auVar6._0_8_;
      local_aa0 = local_1060._0_8_;
      local_1060._8_8_ = auVar6._8_8_;
      uStack_a98 = local_1060._8_8_;
      local_1060._16_8_ = auVar6._16_8_;
      uStack_a90 = local_1060._16_8_;
      local_1060._24_8_ = auVar6._24_8_;
      uStack_a88 = local_1060._24_8_;
      local_ac0 = 0x3f8000003f800000;
      uStack_ab8 = 0x3f8000003f800000;
      uStack_ab0 = 0x3f8000003f800000;
      uStack_aa8 = 0x3f8000003f800000;
      auVar40._8_8_ = 0x3f8000003f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._16_8_ = 0x3f8000003f800000;
      auVar40._24_8_ = 0x3f8000003f800000;
      local_1060 = vandps_avx(auVar6,auVar40);
      local_fe0 = auVar5._0_8_;
      local_f20 = local_fe0;
      uStack_fd8 = auVar5._8_8_;
      uStack_f18 = uStack_fd8;
      uStack_fd0 = auVar5._16_8_;
      uStack_f10 = uStack_fd0;
      uStack_fc8 = auVar5._24_8_;
      uStack_f08 = uStack_fc8;
      local_f40 = local_1060._0_8_;
      uStack_f38 = local_1060._8_8_;
      uStack_f30 = local_1060._16_8_;
      uStack_f28 = local_1060._24_8_;
      local_1000 = vsubps_avx(auVar5,local_1060);
      local_a60 = local_1000;
      local_a50 = ::_ps256_cephes_exp_C1;
      local_4e0 = local_1000._0_8_;
      uStack_4d8 = local_1000._8_8_;
      uStack_4d0 = local_1000._16_8_;
      uStack_4c8 = local_1000._24_8_;
      local_500[0] = 0.6933594;
      local_500[1] = 0.6933594;
      afStack_4f8[0] = 0.6933594;
      afStack_4f8[1] = 0.6933594;
      afStack_4f0[0] = 0.6933594;
      afStack_4f0[1] = 0.6933594;
      afStack_4e8[0] = 0.6933594;
      afStack_4e8[1] = 0.6933594;
      local_520 = local_fc0._0_8_;
      uStack_518 = local_fc0._8_8_;
      uStack_510 = local_fc0._16_8_;
      uStack_508 = local_fc0._24_8_;
      auVar21._8_4_ = 0.6933594;
      auVar21._12_4_ = 0.6933594;
      auVar21._0_4_ = 0.6933594;
      auVar21._4_4_ = 0.6933594;
      auVar21._16_4_ = 0.6933594;
      auVar21._20_4_ = 0.6933594;
      auVar21._24_4_ = 0.6933594;
      auVar21._28_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar21,local_1000,auVar4);
      local_a68 = ::_ps256_cephes_exp_C2;
      local_480 = local_1000._0_8_;
      uStack_478 = local_1000._8_8_;
      uStack_470 = local_1000._16_8_;
      uStack_468 = local_1000._24_8_;
      local_4a0[0] = -0.00021219444;
      local_4a0[1] = -0.00021219444;
      afStack_498[0] = -0.00021219444;
      afStack_498[1] = -0.00021219444;
      afStack_490[0] = -0.00021219444;
      afStack_490[1] = -0.00021219444;
      afStack_488[0] = -0.00021219444;
      afStack_488[1] = -0.00021219444;
      local_fc0._0_8_ = auVar2._0_8_;
      local_4c0 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar2._8_8_;
      uStack_4b8 = local_fc0._8_8_;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      auVar22._8_4_ = -0.00021219444;
      auVar22._12_4_ = -0.00021219444;
      auVar22._0_4_ = -0.00021219444;
      auVar22._4_4_ = -0.00021219444;
      auVar22._16_4_ = -0.00021219444;
      auVar22._20_4_ = -0.00021219444;
      auVar22._24_4_ = -0.00021219444;
      auVar22._28_4_ = -0.00021219444;
      auVar2 = vfnmadd213ps_fma(auVar22,local_1000,ZEXT1632(auVar2));
      auVar40 = ZEXT1632(auVar2);
      local_fc0._0_8_ = auVar2._0_8_;
      local_a00 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar2._8_8_;
      uStack_9f8 = local_fc0._8_8_;
      uStack_9f0 = 0;
      uStack_9e8 = 0;
      local_9e0._0_4_ = auVar2._0_4_;
      local_9e0._4_4_ = auVar2._4_4_;
      uStack_9d8._0_4_ = auVar2._8_4_;
      uStack_9d8._4_4_ = auVar2._12_4_;
      local_fe0._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
      local_fe0._0_4_ = (float)local_9e0 * (float)local_9e0;
      local_560 = local_fe0;
      uStack_fd8._0_4_ = (float)uStack_9d8 * (float)uStack_9d8;
      uStack_fd8._4_4_ = uStack_9d8._4_4_ * uStack_9d8._4_4_;
      auVar1 = _local_fe0;
      _local_fe0 = ZEXT1632(_local_fe0);
      auVar13 = _local_fe0;
      uStack_1078 = 0x3950696739506967;
      local_1080 = (undefined1  [8])0x3950696739506967;
      uStack_1070 = 0x3950696739506967;
      uStack_1068 = 0x3950696739506967;
      local_b58 = local_1080;
      local_af0 = ::_ps256_cephes_exp_p1;
      local_720 = 0x3950696739506967;
      uStack_718 = 0x3950696739506967;
      uStack_710 = 0x3950696739506967;
      uStack_708 = 0x3950696739506967;
      local_740 = local_fc0._0_8_;
      uStack_738 = local_fc0._8_8_;
      uStack_730 = 0;
      uStack_728 = 0;
      local_760[0] = 0.0013981999;
      local_760[1] = 0.0013981999;
      afStack_758[0] = 0.0013981999;
      afStack_758[1] = 0.0013981999;
      afStack_750[0] = 0.0013981999;
      afStack_750[1] = 0.0013981999;
      afStack_748[0] = 0.0013981999;
      afStack_748[1] = 0.0013981999;
      auVar16._8_4_ = 0.0013981999;
      auVar16._12_4_ = 0.0013981999;
      auVar16._0_4_ = 0.0013981999;
      auVar16._4_4_ = 0.0013981999;
      auVar16._16_4_ = 0.0013981999;
      auVar16._20_4_ = 0.0013981999;
      auVar16._24_4_ = 0.0013981999;
      auVar16._28_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(auVar40,_local_1080,auVar16);
      local_b08 = ::_ps256_cephes_exp_p2;
      local_1080 = auVar2._0_8_;
      local_6c0 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uStack_6b8 = uStack_1078;
      uStack_6b0 = 0;
      uStack_6a8 = 0;
      local_6e0 = local_fc0._0_8_;
      uStack_6d8 = local_fc0._8_8_;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700[0] = 0.008333452;
      local_700[1] = 0.008333452;
      afStack_6f8[0] = 0.008333452;
      afStack_6f8[1] = 0.008333452;
      afStack_6f0[0] = 0.008333452;
      afStack_6f0[1] = 0.008333452;
      afStack_6e8[0] = 0.008333452;
      afStack_6e8[1] = 0.008333452;
      auVar17._8_4_ = 0.008333452;
      auVar17._12_4_ = 0.008333452;
      auVar17._0_4_ = 0.008333452;
      auVar17._4_4_ = 0.008333452;
      auVar17._16_4_ = 0.008333452;
      auVar17._20_4_ = 0.008333452;
      auVar17._24_4_ = 0.008333452;
      auVar17._28_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar2),auVar17);
      local_b20 = ::_ps256_cephes_exp_p3;
      local_1080 = auVar2._0_8_;
      local_660 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uStack_658 = uStack_1078;
      uStack_650 = 0;
      uStack_648 = 0;
      local_680 = local_fc0._0_8_;
      uStack_678 = local_fc0._8_8_;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0[0] = 0.041665796;
      local_6a0[1] = 0.041665796;
      afStack_698[0] = 0.041665796;
      afStack_698[1] = 0.041665796;
      afStack_690[0] = 0.041665796;
      afStack_690[1] = 0.041665796;
      afStack_688[0] = 0.041665796;
      afStack_688[1] = 0.041665796;
      auVar18._8_4_ = 0.041665796;
      auVar18._12_4_ = 0.041665796;
      auVar18._0_4_ = 0.041665796;
      auVar18._4_4_ = 0.041665796;
      auVar18._16_4_ = 0.041665796;
      auVar18._20_4_ = 0.041665796;
      auVar18._24_4_ = 0.041665796;
      auVar18._28_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar2),auVar18);
      local_b38 = ::_ps256_cephes_exp_p4;
      local_1080 = auVar2._0_8_;
      local_600 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uStack_5f8 = uStack_1078;
      uStack_5f0 = 0;
      uStack_5e8 = 0;
      local_620 = local_fc0._0_8_;
      uStack_618 = local_fc0._8_8_;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640[0] = 0.16666666;
      local_640[1] = 0.16666666;
      afStack_638[0] = 0.16666666;
      afStack_638[1] = 0.16666666;
      afStack_630[0] = 0.16666666;
      afStack_630[1] = 0.16666666;
      afStack_628[0] = 0.16666666;
      afStack_628[1] = 0.16666666;
      auVar19._8_4_ = 0.16666666;
      auVar19._12_4_ = 0.16666666;
      auVar19._0_4_ = 0.16666666;
      auVar19._4_4_ = 0.16666666;
      auVar19._16_4_ = 0.16666666;
      auVar19._20_4_ = 0.16666666;
      auVar19._24_4_ = 0.16666666;
      auVar19._28_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar2),auVar19);
      local_b50 = ::_ps256_cephes_exp_p5;
      local_1080 = auVar2._0_8_;
      local_5a0 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uStack_598 = uStack_1078;
      uStack_590 = 0;
      uStack_588 = 0;
      local_5c0 = local_fc0._0_8_;
      uStack_5b8 = local_fc0._8_8_;
      uStack_5b0 = 0;
      uStack_5a8 = 0;
      local_5e0[0] = 0.5;
      local_5e0[1] = 0.5;
      afStack_5d8[0] = 0.5;
      afStack_5d8[1] = 0.5;
      afStack_5d0[0] = 0.5;
      afStack_5d0[1] = 0.5;
      afStack_5c8[0] = 0.5;
      afStack_5c8[1] = 0.5;
      auVar20._8_4_ = 0.5;
      auVar20._12_4_ = 0.5;
      auVar20._0_4_ = 0.5;
      auVar20._4_4_ = 0.5;
      auVar20._16_4_ = 0.5;
      auVar20._20_4_ = 0.5;
      auVar20._24_4_ = 0.5;
      auVar20._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar2),auVar20);
      local_b60 = local_fe0;
      local_1080 = auVar2._0_8_;
      local_540 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uStack_538 = uStack_1078;
      uStack_530 = 0;
      uStack_528 = 0;
      uStack_fd8 = auVar1._8_8_;
      uStack_558 = uStack_fd8;
      uStack_550 = 0;
      uStack_548 = 0;
      local_580 = local_fc0._0_8_;
      uStack_578 = local_fc0._8_8_;
      uStack_570 = 0;
      uStack_568 = 0;
      auVar2 = vfmadd213ps_fma(auVar13,ZEXT1632(auVar2),auVar40);
      local_1080 = auVar2._0_8_;
      uVar7 = local_1080;
      uStack_1078 = auVar2._8_8_;
      uVar8 = uStack_1078;
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_f80 = 0x3f8000003f800000;
      uStack_f78 = 0x3f8000003f800000;
      uStack_f70 = 0x3f8000003f800000;
      uStack_f68 = 0x3f8000003f800000;
      local_f60._0_4_ = auVar2._0_4_;
      local_f60._4_4_ = auVar2._4_4_;
      uStack_f58._0_4_ = auVar2._8_4_;
      uStack_f58._4_4_ = auVar2._12_4_;
      local_1080._4_4_ = local_f60._4_4_ + 1.0;
      local_1080._0_4_ = (float)local_f60 + 1.0;
      uStack_1078._0_4_ = (float)uStack_f58 + 1.0;
      uStack_1078._4_4_ = uStack_f58._4_4_ + 1.0;
      uStack_1070._0_4_ = 0x3f800000;
      uStack_1070._4_4_ = 0x3f800000;
      uStack_1068._0_4_ = 0x3f800000;
      uStack_1068._4_4_ = 0x3f800000;
      local_9c0._0_4_ = local_1000._0_4_;
      local_9c0._4_4_ = local_1000._4_4_;
      uStack_9b8._0_4_ = local_1000._8_4_;
      uStack_9b8._4_4_ = local_1000._12_4_;
      uStack_9b0._0_4_ = local_1000._16_4_;
      uStack_9b0._4_4_ = local_1000._20_4_;
      uStack_9a8._0_4_ = local_1000._24_4_;
      uStack_9a8._4_4_ = local_1000._28_4_;
      local_1020 = CONCAT44((int)local_9c0._4_4_,(int)(float)local_9c0);
      uStack_1018 = CONCAT44((int)uStack_9b8._4_4_,(int)(float)uStack_9b8);
      uStack_1010 = CONCAT44((int)uStack_9b0._4_4_,(int)(float)uStack_9b0);
      uStack_1008 = CONCAT44((int)uStack_9a8._4_4_,(int)(float)uStack_9a8);
      local_8c0 = local_1020;
      uStack_8b8 = uStack_1018;
      uStack_8b0 = uStack_1010;
      uStack_8a8 = uStack_1008;
      local_8e0 = 0x7f0000007f;
      uStack_8d8 = 0x7f0000007f;
      uStack_8d0 = 0x7f0000007f;
      uStack_8c8 = 0x7f0000007f;
      local_960 = local_1020;
      uStack_958 = uStack_1018;
      uStack_950 = uStack_1010;
      uStack_948 = uStack_1008;
      local_980 = 0x7f0000007f;
      uStack_978 = 0x7f0000007f;
      uStack_970 = 0x7f0000007f;
      uStack_968 = 0x7f0000007f;
      local_910 = 0x7f0000007f;
      uStack_908 = 0x7f0000007f;
      local_920 = 0x7f0000007f;
      uStack_918 = 0x7f0000007f;
      local_420 = local_1020;
      uStack_418 = uStack_1018;
      local_430 = 0x7f0000007f;
      uStack_428 = 0x7f0000007f;
      auVar23._8_8_ = uStack_1018;
      auVar23._0_8_ = local_1020;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_8f0 = vpaddd_avx(auVar23,auVar3);
      local_440 = uStack_1010;
      uStack_438 = uStack_1008;
      local_450 = 0x7f0000007f;
      uStack_448 = 0x7f0000007f;
      auVar1._8_8_ = uStack_1008;
      auVar1._0_8_ = uStack_1010;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_900 = vpaddd_avx(auVar1,auVar2);
      local_9a0 = local_8f0._0_8_;
      uStack_998 = local_8f0._8_8_;
      uStack_990 = local_900._0_8_;
      uStack_988 = local_900._8_8_;
      local_940 = local_8f0._0_8_;
      uStack_938 = local_8f0._8_8_;
      uStack_930 = local_900._0_8_;
      uStack_928 = local_900._8_8_;
      local_800 = local_8f0._0_8_;
      uStack_7f8 = local_8f0._8_8_;
      uStack_7f0 = local_900._0_8_;
      uStack_7e8 = local_900._8_8_;
      local_804 = 0x17;
      local_880 = local_8f0._0_8_;
      uStack_878 = local_8f0._8_8_;
      uStack_870 = local_900._0_8_;
      uStack_868 = local_900._8_8_;
      local_3c0 = local_8f0._0_8_;
      uStack_3b8 = local_8f0._8_8_;
      local_3c4 = 0x17;
      local_820 = vpslld_avx(local_8f0,ZEXT416(0x17));
      local_3e0 = local_900._0_8_;
      uStack_3d8 = local_900._8_8_;
      local_3e4 = 0x17;
      local_830 = vpslld_avx(local_900,ZEXT416(0x17));
      local_8a0 = local_820._0_8_;
      uStack_898 = local_820._8_8_;
      uStack_890 = local_830._0_8_;
      uStack_888 = local_830._8_8_;
      local_860 = local_820._0_8_;
      uStack_858 = local_820._8_8_;
      uStack_850 = local_830._0_8_;
      uStack_848 = local_830._8_8_;
      local_1020 = local_820._0_8_;
      uStack_1018 = local_820._8_8_;
      uStack_1010 = local_830._0_8_;
      uStack_1008 = local_830._8_8_;
      local_7e0 = local_820._0_8_;
      uStack_7d8 = local_820._8_8_;
      uStack_7d0 = local_830._0_8_;
      uStack_7c8 = local_830._8_8_;
      local_10a0 = local_820._0_8_;
      uStack_1098 = local_820._8_8_;
      uStack_1090 = local_830._0_8_;
      uStack_1088 = local_830._8_8_;
      local_a20 = _local_1080;
      local_a40._0_4_ = local_820._0_4_;
      local_a40._4_4_ = local_820._4_4_;
      uStack_a38._0_4_ = local_820._8_4_;
      uStack_a38._4_4_ = local_820._12_4_;
      uStack_a30._0_4_ = local_830._0_4_;
      uStack_a30._4_4_ = local_830._4_4_;
      uStack_a28._0_4_ = local_830._8_4_;
      local_1080._0_4_ = ((float)local_f60 + 1.0) * (float)local_a40;
      local_1080._4_4_ = (local_f60._4_4_ + 1.0) * local_a40._4_4_;
      uStack_a38._0_4_ = ((float)uStack_f58 + 1.0) * (float)uStack_a38;
      uStack_a38._4_4_ = (uStack_f58._4_4_ + 1.0) * uStack_a38._4_4_;
      uStack_1078._0_4_ = (float)uStack_a38;
      uStack_1078._4_4_ = uStack_a38._4_4_;
      uStack_1070._0_4_ = (float)uStack_a30 * 1.0;
      uStack_1070._4_4_ = uStack_a30._4_4_ * 1.0;
      auVar38 = _local_1080;
      uStack_1068._0_4_ = (float)uStack_a28 * 1.0;
      uStack_1068._4_4_ = 0x3f800000;
      auVar5 = _local_1080;
      local_10e0 = local_1080;
      uStack_10d8 = uStack_1078;
      uStack_1070 = auVar38._16_8_;
      uStack_10d0 = uStack_1070;
      uStack_1068 = auVar5._24_8_;
      uStack_10c8 = uStack_1068;
      local_10c0._0_4_ = local_c40._0_4_;
      local_10c0._4_4_ = local_c40._4_4_;
      uStack_10b8._0_4_ = local_c40._8_4_;
      uStack_10b8._4_4_ = local_c40._12_4_;
      uStack_10b0._0_4_ = auStack_c30._0_4_;
      uStack_10b0._4_4_ = auStack_c30._4_4_;
      uStack_10a8._0_4_ = auStack_c30._8_4_;
      uStack_10a8._4_4_ = auStack_c30._12_4_;
      local_1120 = (float)local_10c0 + (float)local_1080._0_4_;
      fStack_111c = local_10c0._4_4_ + (float)local_1080._4_4_;
      fStack_1118 = (float)uStack_10b8 + (float)uStack_a38;
      fStack_1114 = uStack_10b8._4_4_ + uStack_a38._4_4_;
      fStack_1110 = (float)uStack_10b0 + (float)uStack_a30 * 1.0;
      fStack_110c = uStack_10b0._4_4_ + uStack_a30._4_4_ * 1.0;
      fStack_1108 = (float)uStack_10a8 + (float)uStack_a28 * 1.0;
      fStack_1104 = uStack_10a8._4_4_ + 1.0;
      auVar4._16_8_ = auStack_c30._0_8_;
      auVar4._0_16_ = local_c40;
      auVar4._24_8_ = auStack_c30._8_8_;
      auVar6._4_4_ = fStack_111c;
      auVar6._0_4_ = local_1120;
      auVar6._8_4_ = fStack_1118;
      auVar6._12_4_ = fStack_1114;
      auVar6._16_4_ = fStack_1110;
      auVar6._20_4_ = fStack_110c;
      auVar6._24_4_ = fStack_1108;
      auVar6._28_4_ = fStack_1104;
      auVar6 = vdivps_avx(auVar4,auVar6);
      local_e88 = local_11e0;
      local_12a0 = auVar6._0_8_;
      local_ec0 = local_12a0;
      uStack_1298 = auVar6._8_8_;
      uStack_eb8 = uStack_1298;
      uStack_1290 = auVar6._16_8_;
      uStack_eb0 = uStack_1290;
      uStack_1288 = auVar6._24_8_;
      uStack_ea8 = uStack_1288;
      *(undefined8 *)*local_11e0 = local_12a0;
      *(undefined8 *)(*local_11e0 + 8) = uStack_1298;
      *(undefined8 *)(*local_11e0 + 0x10) = uStack_1290;
      *(undefined8 *)(*local_11e0 + 0x18) = uStack_1288;
      local_11e0 = local_11e0 + 1;
      local_10c0 = local_1100;
      uStack_10b8 = uStack_10f8;
      uStack_10b0 = uStack_10f0;
      uStack_10a8 = uStack_10e8;
      _local_1080 = auVar5;
      _local_fe0 = auVar13;
      local_fc0 = auVar40;
      local_f60 = uVar7;
      uStack_f58 = uVar8;
      local_b48 = local_b68;
      local_b40 = local_b58;
      local_b30 = local_b68;
      local_b28 = local_b58;
      local_b18 = local_b68;
      local_b10 = local_b58;
      local_b00 = local_b68;
      local_af8 = local_b58;
      local_ae8 = local_b68;
      local_ae0 = local_b58;
      local_ac8 = local_b68;
      local_a70 = local_b68;
      local_a58 = local_b68;
      local_a48 = local_a60;
      local_a40 = local_820._0_8_;
      uStack_a38 = local_820._8_8_;
      uStack_a30 = local_830._0_8_;
      uStack_a28 = local_830._8_8_;
      local_9e0 = local_a00;
      uStack_9d8 = uStack_9f8;
      uStack_9d0 = uStack_9f0;
      uStack_9c8 = uStack_9e8;
      local_9c0 = local_1000._0_8_;
      uStack_9b8 = local_1000._8_8_;
      uStack_9b0 = local_1000._16_8_;
      uStack_9a8 = local_1000._24_8_;
    }
    local_e64 = 0x3f800000;
    local_e80 = 0x3f800000;
    uStack_e7c = 0x3f800000;
    uStack_e78 = 0x3f800000;
    uStack_e74 = 0x3f800000;
    local_e60._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_1160 = ZEXT832(0) << 0x20, auVar2 = ZEXT816(0) << 0x20, local_c70 = local_1178,
        local_1208 = local_cd0, local_1238 + 3 < local_11d0; local_1238 = local_1238 + 4) {
      local_e48 = local_11e0;
      local_d10 = *(undefined8 *)*local_11e0;
      uStack_d08 = *(undefined8 *)(*local_11e0 + 8);
      local_d00 = 0;
      uStack_cf8 = local_e60._8_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_e60._8_8_;
      auVar2 = vsubps_avx(auVar39 << 0x40,*(undefined1 (*) [16])*local_11e0);
      local_d80 = ZEXT816(0) << 0x20;
      local_dd0 = 0x3f8000003f800000;
      uStack_dc8 = 0x3f8000003f800000;
      local_d90._0_8_ = auVar2._0_8_;
      local_380 = local_d90._0_8_;
      local_d90._8_8_ = auVar2._8_8_;
      uStack_378 = local_d90._8_8_;
      local_390 = 0x42b0c0a542b0c0a5;
      uStack_388 = 0x42b0c0a542b0c0a5;
      auVar26._8_8_ = 0x42b0c0a542b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar26);
      local_d90._0_8_ = auVar2._0_8_;
      local_360 = local_d90._0_8_;
      local_d90._8_8_ = auVar2._8_8_;
      uStack_358 = local_d90._8_8_;
      local_370 = 0xc2b0c0a5c2b0c0a5;
      uStack_368 = 0xc2b0c0a5c2b0c0a5;
      auVar27._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar27);
      local_d90._0_8_ = auVar3._0_8_;
      uVar7 = local_d90._0_8_;
      local_d90._8_8_ = auVar3._8_8_;
      uVar8 = local_d90._8_8_;
      local_310 = 0x3fb8aa3b3fb8aa3b;
      uStack_308 = 0x3fb8aa3b3fb8aa3b;
      local_300._0_4_ = auVar3._0_4_;
      local_300._4_4_ = auVar3._4_4_;
      uStack_2f8._0_4_ = auVar3._8_4_;
      uStack_2f8._4_4_ = auVar3._12_4_;
      local_db0._4_4_ = local_300._4_4_ * 1.442695;
      local_db0._0_4_ = (float)local_300 * 1.442695;
      uStack_da8._0_4_ = (float)uStack_2f8 * 1.442695;
      uStack_da8._4_4_ = uStack_2f8._4_4_ * 1.442695;
      local_d40 = local_db0;
      uStack_d38 = uStack_da8;
      local_d50 = 0x3f0000003f000000;
      uStack_d48 = 0x3f0000003f000000;
      local_db0._0_4_ = (float)local_300 * 1.442695 + 0.5;
      local_db0._4_4_ = local_300._4_4_ * 1.442695 + 0.5;
      fVar41 = (float)uStack_2f8 * 1.442695 + 0.5;
      fVar42 = uStack_2f8._4_4_ * 1.442695 + 0.5;
      uStack_da8._0_4_ = fVar41;
      uStack_da8._4_4_ = fVar42;
      local_2e0 = local_db0;
      uStack_2d8 = uStack_da8;
      local_dc0._4_4_ = (int)(float)local_db0._4_4_;
      local_dc0._0_4_ = (int)(float)local_db0._0_4_;
      local_dc0._8_4_ = (int)fVar41;
      local_dc0._12_4_ = (int)fVar42;
      local_2d0 = local_dc0._0_8_;
      uStack_2c8 = local_dc0._8_8_;
      auVar28._8_8_ = local_dc0._8_8_;
      auVar28._0_8_ = local_dc0._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar28);
      local_da0 = auVar1._0_8_;
      local_2b0 = local_da0;
      uStack_d98 = auVar1._8_8_;
      uStack_2a8 = uStack_d98;
      local_2c0 = local_db0;
      uStack_2b8 = uStack_da8;
      auVar29._8_8_ = uStack_da8;
      auVar29._0_8_ = local_db0;
      auVar2 = vcmpps_avx(auVar29,auVar1,1);
      local_de0._0_8_ = auVar2._0_8_;
      local_290 = local_de0._0_8_;
      local_de0._8_8_ = auVar2._8_8_;
      uStack_288 = local_de0._8_8_;
      local_2a0 = 0x3f8000003f800000;
      uStack_298 = 0x3f8000003f800000;
      auVar30._8_8_ = 0x3f8000003f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      local_de0 = vpand_avx(auVar2,auVar30);
      local_d20 = local_da0;
      uStack_d18 = uStack_d98;
      local_d30 = local_de0._0_8_;
      uStack_d28 = local_de0._8_8_;
      _local_db0 = vsubps_avx(auVar1,local_de0);
      local_270 = local_db0;
      local_260 = ::_ps_cephes_exp_C1;
      local_280 = local_d90;
      local_190 = local_db0;
      uStack_188 = uStack_da8;
      local_1a0[0] = 0.6933594;
      local_1a0[1] = 0.6933594;
      afStack_198[0] = 0.6933594;
      afStack_198[1] = 0.6933594;
      local_1b0 = local_d90._0_8_;
      uStack_1a8 = local_d90._8_8_;
      auVar31._8_4_ = 0.6933594;
      auVar31._12_4_ = 0.6933594;
      auVar31._0_4_ = 0.6933594;
      auVar31._4_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar31,_local_db0,auVar3);
      local_278 = ::_ps_cephes_exp_C2;
      local_160 = local_db0;
      uStack_158 = uStack_da8;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_d90._0_8_ = auVar2._0_8_;
      local_180 = local_d90._0_8_;
      local_d90._8_8_ = auVar2._8_8_;
      uStack_178 = local_d90._8_8_;
      auVar32._8_4_ = -0.00021219444;
      auVar32._12_4_ = -0.00021219444;
      auVar32._0_4_ = -0.00021219444;
      auVar32._4_4_ = -0.00021219444;
      local_d90 = vfnmadd213ps_fma(auVar32,_local_db0,auVar2);
      local_330 = local_d90._0_8_;
      uStack_328 = local_d90._8_8_;
      local_320._0_4_ = local_d90._0_4_;
      local_320._4_4_ = local_d90._4_4_;
      uStack_318._0_4_ = local_d90._8_4_;
      uStack_318._4_4_ = local_d90._12_4_;
      local_da0._4_4_ = local_320._4_4_ * local_320._4_4_;
      local_da0._0_4_ = (float)local_320 * (float)local_320;
      uStack_d98._0_4_ = (float)uStack_318 * (float)uStack_318;
      uStack_d98._4_4_ = uStack_318._4_4_ * uStack_318._4_4_;
      uStack_de8 = 0x3950696739506967;
      local_df0 = (undefined1  [8])0x3950696739506967;
      local_240 = local_df0;
      local_1d8 = ::_ps_cephes_exp_p1;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_d90._0_8_;
      uStack_138 = local_d90._8_8_;
      local_150[0] = 0.0013981999;
      local_150[1] = 0.0013981999;
      afStack_148[0] = 0.0013981999;
      afStack_148[1] = 0.0013981999;
      auVar33._8_4_ = 0.0013981999;
      auVar33._12_4_ = 0.0013981999;
      auVar33._0_4_ = 0.0013981999;
      auVar33._4_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(local_d90,_local_df0,auVar33);
      local_1f0 = ::_ps_cephes_exp_p2;
      local_df0 = auVar2._0_8_;
      local_100 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uStack_f8 = uStack_de8;
      local_110 = local_d90._0_8_;
      uStack_108 = local_d90._8_8_;
      local_120[0] = 0.008333452;
      local_120[1] = 0.008333452;
      afStack_118[0] = 0.008333452;
      afStack_118[1] = 0.008333452;
      auVar34._8_4_ = 0.008333452;
      auVar34._12_4_ = 0.008333452;
      auVar34._0_4_ = 0.008333452;
      auVar34._4_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(local_d90,auVar2,auVar34);
      local_208 = ::_ps_cephes_exp_p3;
      local_df0 = auVar2._0_8_;
      local_d0 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uStack_c8 = uStack_de8;
      local_e0 = local_d90._0_8_;
      uStack_d8 = local_d90._8_8_;
      local_f0[0] = 0.041665796;
      local_f0[1] = 0.041665796;
      afStack_e8[0] = 0.041665796;
      afStack_e8[1] = 0.041665796;
      auVar35._8_4_ = 0.041665796;
      auVar35._12_4_ = 0.041665796;
      auVar35._0_4_ = 0.041665796;
      auVar35._4_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(local_d90,auVar2,auVar35);
      local_220 = ::_ps_cephes_exp_p4;
      local_df0 = auVar2._0_8_;
      local_a0 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uStack_98 = uStack_de8;
      local_b0 = local_d90._0_8_;
      uStack_a8 = local_d90._8_8_;
      local_c0[0] = 0.16666666;
      local_c0[1] = 0.16666666;
      afStack_b8[0] = 0.16666666;
      afStack_b8[1] = 0.16666666;
      auVar36._8_4_ = 0.16666666;
      auVar36._12_4_ = 0.16666666;
      auVar36._0_4_ = 0.16666666;
      auVar36._4_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(local_d90,auVar2,auVar36);
      local_238 = ::_ps_cephes_exp_p5;
      local_df0 = auVar2._0_8_;
      local_70 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uStack_68 = uStack_de8;
      local_80 = local_d90._0_8_;
      uStack_78 = local_d90._8_8_;
      local_90[0] = 0.5;
      local_90[1] = 0.5;
      afStack_88[0] = 0.5;
      afStack_88[1] = 0.5;
      auVar37._8_4_ = 0.5;
      auVar37._12_4_ = 0.5;
      auVar37._0_4_ = 0.5;
      auVar37._4_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(local_d90,auVar2,auVar37);
      local_248 = local_da0;
      local_df0 = auVar2._0_8_;
      local_40 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uStack_38 = uStack_de8;
      local_50 = local_da0;
      uStack_48 = uStack_d98;
      local_60 = local_d90._0_8_;
      uStack_58 = local_d90._8_8_;
      auVar2 = vfmadd213ps_fma(_local_da0,auVar2,local_d90);
      local_df0 = auVar2._0_8_;
      uVar9 = local_df0;
      uStack_de8 = auVar2._8_8_;
      uVar10 = uStack_de8;
      local_d70 = 0x3f8000003f800000;
      uStack_d68 = 0x3f8000003f800000;
      local_d60._0_4_ = auVar2._0_4_;
      local_d60._4_4_ = auVar2._4_4_;
      uStack_d58._0_4_ = auVar2._8_4_;
      uStack_d58._4_4_ = auVar2._12_4_;
      local_df0._4_4_ = local_d60._4_4_ + 1.0;
      local_df0._0_4_ = (float)local_d60 + 1.0;
      uStack_de8._0_4_ = (float)uStack_d58 + 1.0;
      uStack_de8._4_4_ = uStack_d58._4_4_ + 1.0;
      local_2f0._0_4_ = local_db0._0_4_;
      local_2f0._4_4_ = local_db0._4_4_;
      uStack_2e8._0_4_ = local_db0._8_4_;
      uStack_2e8._4_4_ = local_db0._12_4_;
      local_dc0._4_4_ = (int)local_2f0._4_4_;
      local_dc0._0_4_ = (int)(float)local_2f0;
      local_dc0._8_4_ = (int)(float)uStack_2e8;
      local_dc0._12_4_ = (int)uStack_2e8._4_4_;
      local_400 = local_dc0._0_8_;
      uStack_3f8 = local_dc0._8_8_;
      local_410 = 0x7f0000007f;
      uStack_408 = 0x7f0000007f;
      auVar25._8_8_ = local_dc0._8_8_;
      auVar25._0_8_ = local_dc0._0_8_;
      auVar24._8_8_ = 0x7f0000007f;
      auVar24._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar25,auVar24);
      local_dc0._0_8_ = auVar2._0_8_;
      local_3a0 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar2._8_8_;
      uStack_398 = local_dc0._8_8_;
      local_3a4 = 0x17;
      local_dc0 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_1c0 = local_dc0._0_8_;
      uStack_1b8 = local_dc0._8_8_;
      local_e00 = local_dc0._0_8_;
      uStack_df8 = local_dc0._8_8_;
      local_340 = _local_df0;
      local_350._0_4_ = local_dc0._0_4_;
      local_350._4_4_ = local_dc0._4_4_;
      uStack_348._0_4_ = local_dc0._8_4_;
      uStack_348._4_4_ = local_dc0._12_4_;
      local_df0._0_4_ = ((float)local_d60 + 1.0) * (float)local_350;
      local_df0._4_4_ = (local_d60._4_4_ + 1.0) * local_350._4_4_;
      uStack_348._0_4_ = ((float)uStack_d58 + 1.0) * (float)uStack_348;
      uStack_348._4_4_ = (uStack_d58._4_4_ + 1.0) * uStack_348._4_4_;
      uStack_de8._0_4_ = (float)uStack_348;
      uStack_de8._4_4_ = uStack_348._4_4_;
      local_e20 = local_df0;
      uStack_e18 = uStack_de8;
      local_e40 = (float)local_df0._0_4_ + 1.0;
      fStack_e3c = (float)local_df0._4_4_ + 1.0;
      fStack_e38 = (float)uStack_348 + 1.0;
      fStack_e34 = uStack_348._4_4_ + 1.0;
      auVar12._8_8_ = 0x3f8000003f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar11._4_4_ = fStack_e3c;
      auVar11._0_4_ = local_e40;
      auVar11._8_4_ = fStack_e38;
      auVar11._12_4_ = fStack_e34;
      auVar2 = vdivps_avx(auVar12,auVar11);
      local_cd8 = local_11e0;
      local_12d0 = auVar2._0_8_;
      local_cf0 = local_12d0;
      uStack_12c8 = auVar2._8_8_;
      uStack_ce8 = uStack_12c8;
      *(undefined8 *)*local_11e0 = local_12d0;
      *(undefined8 *)(*local_11e0 + 8) = uStack_12c8;
      local_11e0 = (undefined1 (*) [32])(*local_11e0 + 0x10);
      local_e30 = 0x3f8000003f800000;
      uStack_e28 = 0x3f8000003f800000;
      local_e10 = 0x3f8000003f800000;
      uStack_e08 = 0x3f8000003f800000;
      local_d60 = uVar9;
      uStack_d58 = uVar10;
      local_350 = local_dc0._0_8_;
      uStack_348 = local_dc0._8_8_;
      local_320 = local_330;
      uStack_318 = uStack_328;
      local_300 = uVar7;
      uStack_2f8 = uVar8;
      local_2f0 = local_db0;
      uStack_2e8 = uStack_da8;
      local_268 = local_280;
      local_258 = local_270;
      local_250 = local_280;
      local_230 = local_280;
      local_228 = local_240;
      local_218 = local_280;
      local_210 = local_240;
      local_200 = local_280;
      local_1f8 = local_240;
      local_1e8 = local_280;
      local_1e0 = local_240;
      local_1d0 = local_280;
      local_1c8 = local_240;
    }
    for (; local_e60 = auVar2, local_1238 < local_11d0; local_1238 = local_1238 + 1) {
      fVar41 = expf(-*(float *)*local_11e0);
      *(float *)*local_11e0 = 1.0 / (fVar41 + 1.0);
      local_11e0 = (undefined1 (*) [32])(*local_11e0 + 4);
      auVar2 = local_e60;
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}